

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SrcListIndexedBy(Parse *pParse,SrcList *p,Token *pIndexedBy)

{
  char *pcVar1;
  long *in_RDX;
  int *in_RSI;
  SrcItem *pItem;
  Token *in_stack_ffffffffffffffd8;
  sqlite3 *db;
  
  if ((in_RSI != (int *)0x0) && ((int)in_RDX[1] != 0)) {
    db = (sqlite3 *)(in_RSI + (long)(*in_RSI + -1) * 0x12 + 2);
    if (((int)in_RDX[1] == 1) && (*in_RDX == 0)) {
      *(ushort *)((long)&db->mutex + 1) = *(ushort *)((long)&db->mutex + 1) & 0xfffe | 1;
    }
    else {
      pcVar1 = sqlite3NameFromToken(db,in_stack_ffffffffffffffd8);
      *(char **)&db->nDb = pcVar1;
      *(ushort *)((long)&db->mutex + 1) = *(ushort *)((long)&db->mutex + 1) & 0xfffd | 2;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListIndexedBy(Parse *pParse, SrcList *p, Token *pIndexedBy){
  assert( pIndexedBy!=0 );
  if( p && pIndexedBy->n>0 ){
    SrcItem *pItem;
    assert( p->nSrc>0 );
    pItem = &p->a[p->nSrc-1];
    assert( pItem->fg.notIndexed==0 );
    assert( pItem->fg.isIndexedBy==0 );
    assert( pItem->fg.isTabFunc==0 );
    if( pIndexedBy->n==1 && !pIndexedBy->z ){
      /* A "NOT INDEXED" clause was supplied. See parse.y
      ** construct "indexed_opt" for details. */
      pItem->fg.notIndexed = 1;
    }else{
      pItem->u1.zIndexedBy = sqlite3NameFromToken(pParse->db, pIndexedBy);
      pItem->fg.isIndexedBy = 1;
      assert( pItem->fg.isCte==0 );  /* No collision on union u2 */
    }
  }
}